

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::PtrOffsetInst::useVars(PtrOffsetInst *this)

{
  char *pcVar1;
  value_type *in_RSI;
  uint32_t *__s;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *s;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *this_00;
  
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  this_00 = in_RDI;
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x2c1653);
  __s = &in_RSI[1].id;
  pVar2 = std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::insert(this_00,in_RSI);
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(in_RSI + 3),(char *)__s,pVar2._8_4_);
  if (pcVar1 == (char *)0x1) {
    std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x2c16a9);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert(this_00,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::set<VarId> useVars() const {
    auto s = std::set<VarId>();
    s.insert(ptr);
    if (offset.index() == 1) {
      s.insert(std::get<VarId>(offset));
    }
    return s;
  }